

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelPackage.cpp
# Opt level: O3

vector<MPL::ModelPackageItemInfo,_std::allocator<MPL::ModelPackageItemInfo>_> * __thiscall
MPL::detail::ModelPackageImpl::findItemsByAuthor
          (vector<MPL::ModelPackageItemInfo,_std::allocator<MPL::ModelPackageItemInfo>_>
           *__return_storage_ptr__,ModelPackageImpl *this,string *author)

{
  element_type *peVar1;
  size_t __n;
  undefined8 __x;
  long lVar2;
  int iVar3;
  long lVar4;
  unique_ptr<JsonMap,_std::default_delete<JsonMap>_> itemInfoEntries;
  shared_ptr<MPL::ModelPackageItemInfo> itemInfo;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  identifiers;
  undefined1 local_60 [16];
  undefined1 local_50 [16];
  long lStack_40;
  _Alloc_hider local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<MPL::ModelPackageItemInfo,_std::allocator<MPL::ModelPackageItemInfo>_>)._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<MPL::ModelPackageItemInfo,_std::allocator<MPL::ModelPackageItemInfo>_>)._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<MPL::ModelPackageItemInfo,_std::allocator<MPL::ModelPackageItemInfo>_>)._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  getItemInfoEntries((ModelPackageImpl *)local_60);
  if ((JsonMap *)local_60._0_8_ != (JsonMap *)0x0) {
    local_50._8_8_ = 0;
    lStack_40 = 0;
    local_38._M_p = (pointer)0x0;
    JsonMap::getKeys((JsonMap *)local_60._0_8_,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(local_50 + 8));
    lVar2 = lStack_40;
    if (local_50._8_8_ != lStack_40) {
      lVar4 = local_50._8_8_;
      do {
        findItem((ModelPackageImpl *)(local_60 + 8),(string *)this);
        __x = local_60._8_8_;
        peVar1 = (((shared_ptr<MPL::detail::ModelPackageItemInfoImpl> *)local_60._8_8_)->
                 super___shared_ptr<MPL::detail::ModelPackageItemInfoImpl,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        __n = (peVar1->m_author)._M_string_length;
        if (__n == author->_M_string_length) {
          if (__n != 0) {
            iVar3 = bcmp((peVar1->m_author)._M_dataplus._M_p,(author->_M_dataplus)._M_p,__n);
            if (iVar3 != 0) goto LAB_00121998;
          }
          std::vector<MPL::ModelPackageItemInfo,_std::allocator<MPL::ModelPackageItemInfo>_>::
          push_back(__return_storage_ptr__,(value_type *)__x);
        }
LAB_00121998:
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._0_8_);
        }
        lVar4 = lVar4 + 0x20;
      } while (lVar4 != lVar2);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_50 + 8));
  }
  std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::~unique_ptr
            ((unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)local_60);
  return __return_storage_ptr__;
}

Assistant:

std::vector<ModelPackageItemInfo> ModelPackageImpl::findItemsByAuthor(const std::string& author) const
{
    auto itemInfoVector = std::vector<ModelPackageItemInfo>();
    auto itemInfoEntries = getItemInfoEntries();
    if (itemInfoEntries != nullptr) {
        std::vector<std::string> identifiers;
        itemInfoEntries->getKeys(identifiers);
        for (const auto& identifier : identifiers) {
            auto itemInfo = findItem(identifier);
        	if (itemInfo->author() == author) {
	            itemInfoVector.push_back(*itemInfo);
	        }
        }
    }
    
    return itemInfoVector;
}